

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall
CVmObjFile::getp_open_res_text(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_rcdesc rc;
  vm_rcdesc *in_stack_00000120;
  int in_stack_0000012c;
  uint *in_stack_00000130;
  vm_val_t *in_stack_00000138;
  CVmMetaclass *in_stack_ffffffffffffffa0;
  uint *in_stack_ffffffffffffffb0;
  vm_val_t *in_stack_ffffffffffffffb8;
  unsigned_short in_stack_ffffffffffffffc2;
  vm_obj_id_t in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  vm_rcdesc *in_stack_ffffffffffffffd0;
  
  CVmMetaclass::get_class_obj(in_stack_ffffffffffffffa0);
  CVmStack::get(0);
  vm_rcdesc::vm_rcdesc
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             in_stack_ffffffffffffffc2,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  iVar1 = s_getp_open_text(in_stack_00000138,in_stack_00000130,in_stack_0000012c,in_stack_00000120);
  return iVar1;
}

Assistant:

int CVmObjFile::getp_open_res_text(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *argc)
{
    vm_rcdesc rc(vmg_ "File.openTextResource",
                 CVmObjFile::metaclass_reg_->get_class_obj(vmg0_),
                 VMOBJFILE_OPEN_RES_TEXT, G_stk->get(0), argc);
    return s_getp_open_text(vmg_ retval, argc, TRUE, &rc);
}